

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::inertia::mark_bisection
          (inertia *this,CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> *axis)

{
  Real RVar1;
  Vector<3> center_00;
  Vector<3> center_01;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  Read<double> local_188;
  Read<double> local_178;
  shared_ptr<Omega_h::Comm> local_168;
  double local_158;
  double dStack_150;
  double local_148;
  Read<double> local_140;
  Read<double> local_130;
  shared_ptr<Omega_h::Comm> local_120;
  Vector<3> local_110;
  Read<double> local_f8;
  Read<double> local_e8;
  shared_ptr<Omega_h::Comm> local_d8;
  undefined1 auStack_c8 [8];
  Vector<3> center;
  Read<double> local_a0;
  shared_ptr<Omega_h::Comm> local_90;
  Real local_80;
  Real total_mass;
  Vector<3> *axis_local;
  Real tolerance_local;
  Reals *masses_local;
  Reals *coords_local;
  CommPtr *comm_local;
  Reals *local_48;
  Reals *local_40;
  Reals *local_38;
  Reals *local_30;
  Reals *local_28;
  ulong local_20;
  Reals *local_18;
  ulong local_10;
  
  if (((ulong)(coords->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((coords->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(coords->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(masses->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((masses->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(masses->write_).shared_alloc_.alloc >> 3;
  }
  total_mass = (Real)axis;
  axis_local = (Vector<3> *)tolerance;
  tolerance_local = (Real)masses;
  masses_local = coords;
  coords_local = (Reals *)comm;
  comm_local = (CommPtr *)this;
  local_48 = masses;
  local_40 = coords;
  local_38 = coords;
  local_30 = masses;
  local_28 = masses;
  local_18 = coords;
  if ((int)(local_10 >> 3) == (int)(local_20 >> 3) * 3) {
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_90,comm);
    Read<double>::Read(&local_a0,masses);
    RVar1 = repro_sum(&local_90,&local_a0);
    Read<double>::~Read(&local_a0);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_90);
    local_80 = RVar1;
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_d8,comm);
    Read<double>::Read(&local_e8,coords);
    Read<double>::Read(&local_f8,masses);
    anon_unknown_0::get_center((Vector<3> *)auStack_c8,&local_d8,&local_e8,&local_f8,local_80);
    Read<double>::~Read(&local_f8);
    Read<double>::~Read(&local_e8);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_d8);
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_120,comm);
    Read<double>::Read(&local_130,coords);
    Read<double>::Read(&local_140,masses);
    local_148 = center.super_Few<double,_3>.array_[1];
    local_158 = (double)auStack_c8;
    dStack_150 = center.super_Few<double,_3>.array_[0];
    center_00.super_Few<double,_3>.array_[1] = center.super_Few<double,_3>.array_[0];
    center_00.super_Few<double,_3>.array_[0] = (double)auStack_c8;
    center_00.super_Few<double,_3>.array_[2] = center.super_Few<double,_3>.array_[1];
    anon_unknown_0::get_axis(&local_110,&local_120,&local_130,&local_140,center_00);
    *(double *)((long)total_mass + 0x10) = local_110.super_Few<double,_3>.array_[2];
    *(double *)total_mass = local_110.super_Few<double,_3>.array_[0];
    *(double *)((long)total_mass + 8) = local_110.super_Few<double,_3>.array_[1];
    Read<double>::~Read(&local_140);
    Read<double>::~Read(&local_130);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_120);
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_168,comm);
    Read<double>::Read(&local_178,coords);
    Read<double>::Read(&local_188,masses);
    center_01.super_Few<double,_3>.array_[1] = center.super_Few<double,_3>.array_[0];
    center_01.super_Few<double,_3>.array_[0] = (double)auStack_c8;
    center_01.super_Few<double,_3>.array_[2] = center.super_Few<double,_3>.array_[1];
    anon_unknown_0::mark_bisection_internal
              ((CommPtr *)this,(Reals *)&local_168,&local_178,(Real)axis_local,
               (Few<double,_3>)*(Few<double,_3> *)total_mass,center_01,local_80);
    Read<double>::~Read(&local_188);
    Read<double>::~Read(&local_178);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_168);
    RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar2.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","coords.size() == masses.size() * 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
       ,0x91);
}

Assistant:

Read<I8> mark_bisection(
    CommPtr comm, Reals coords, Reals masses, Real tolerance, Vector<3>& axis) {
  OMEGA_H_CHECK(coords.size() == masses.size() * 3);
  auto total_mass = repro_sum(comm, masses);
  auto center = get_center(comm, coords, masses, total_mass);
  axis = get_axis(comm, coords, masses, center);
  return mark_bisection_internal(
      comm, coords, masses, tolerance, axis, center, total_mass);
}